

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

optional<unsigned_int> convert_gram(IndexType type,uint64_t source)

{
  size_t __n;
  TrigramGenerator p_Var1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mem;
  uint *local_98;
  uint *puStack_90;
  long local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  __n = get_ngram_size_for(type);
  local_88 = 0;
  local_98 = (uint *)0x0;
  puStack_90 = (uint *)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_78,__n);
  lVar3 = __n * 8 + -8;
  do {
    local_58._M_pod_data[0] = (char)(source >> ((byte)lVar3 & 0x3f));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_78,(uchar *)local_58._M_pod_data);
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  p_Var1 = get_generator_for(type);
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Utils.cpp:79:27)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Utils.cpp:79:27)>
             ::_M_manager;
  local_58._M_unused._M_object = &local_98;
  (*p_Var1)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,__n,(TrigramCallback *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_98 == puStack_90) {
    uVar4 = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)*local_98;
    uVar4 = 0x100000000;
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98 != (uint *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)(uVar2 | uVar4);
}

Assistant:

std::optional<TriGram> convert_gram(IndexType type, uint64_t source) {
    int size = get_ngram_size_for(type);
    std::vector<TriGram> result;
    std::vector<uint8_t> mem;
    mem.reserve(size);
    for (int i = 0; i < size; i++) {
        mem.push_back(((source) >> ((size - i - 1) * 8)) & 0xFF);
    }
    get_generator_for(type)(
        mem.data(), size, [&result](uint32_t gram) { result.push_back(gram); });
    if (result.empty()) {
        return std::nullopt;
    }
    return std::make_optional(result[0]);
}